

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void glist_doread(_glist *x,t_symbol *filename,t_symbol *format,int clearme)

{
  int iVar1;
  int iVar2;
  _binbuf *b_00;
  _glist *x_00;
  int local_40;
  int cr;
  int wasvis;
  _glist *canvas;
  _binbuf *b;
  int clearme_local;
  t_symbol *format_local;
  t_symbol *filename_local;
  _glist *x_local;
  
  b_00 = binbuf_new();
  x_00 = glist_getcanvas(x);
  iVar1 = glist_isvisible(x_00);
  local_40 = 0;
  iVar2 = strcmp(format->s_name,"cr");
  if (iVar2 == 0) {
    local_40 = 1;
  }
  else if (*format->s_name != '\0') {
    pd_error((void *)0x0,"qlist_read: unknown flag: %s",format->s_name);
  }
  iVar2 = binbuf_read_via_canvas(b_00,filename->s_name,x_00,local_40);
  if (iVar2 == 0) {
    if (iVar1 != 0) {
      canvas_vis(x_00,0.0);
    }
    if (clearme != 0) {
      glist_clear(x);
    }
    glist_readfrombinbuf(x,b_00,filename->s_name,0);
    if (iVar1 != 0) {
      canvas_vis(x_00,1.0);
    }
    binbuf_free(b_00);
  }
  else {
    pd_error(x,"read failed");
    binbuf_free(b_00);
  }
  return;
}

Assistant:

static void glist_doread(t_glist *x, t_symbol *filename, t_symbol *format,
    int clearme)
{
    t_binbuf *b = binbuf_new();
    t_canvas *canvas = glist_getcanvas(x);
    int wasvis = glist_isvisible(canvas);
    int cr = 0;

    if (!strcmp(format->s_name, "cr"))
        cr = 1;
    else if (*format->s_name)
        pd_error(0, "qlist_read: unknown flag: %s", format->s_name);

    if (binbuf_read_via_canvas(b, filename->s_name, canvas, cr))
    {
        pd_error(x, "read failed");
        binbuf_free(b);
        return;
    }
    if (wasvis)
        canvas_vis(canvas, 0);
    if (clearme)
        glist_clear(x);
    glist_readfrombinbuf(x, b, filename->s_name, 0);
    if (wasvis)
        canvas_vis(canvas, 1);
    binbuf_free(b);
}